

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-vec1.c
# Opt level: O0

void mul_mat_vec_f32_2(float *src0,float *src1,float *dst,int nrows,int ncols)

{
  undefined1 auVar1 [16];
  __m256 v;
  long lVar2;
  undefined1 (*pauVar3) [32];
  long lVar4;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  float fVar5;
  int j_1;
  __m256 b3;
  __m256 b2;
  __m256 b1;
  __m256 b0;
  __m256 a3;
  __m256 a2;
  __m256 a1;
  __m256 a0;
  int j;
  float *src0_row;
  __m256 sum3;
  __m256 sum2;
  __m256 sum1;
  __m256 sum0;
  int i;
  int ncols32;
  uint local_524;
  undefined8 in_stack_fffffffffffffb38;
  undefined8 in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb48;
  undefined8 in_stack_fffffffffffffb50;
  int local_40c;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  int local_368;
  
  for (local_368 = 0; local_368 < in_ECX; local_368 = local_368 + 1) {
    local_3a0 = ZEXT832(0);
    local_3c0 = ZEXT832(0);
    local_3e0 = ZEXT832(0);
    local_400 = ZEXT832(0);
    lVar2 = in_RDI + (long)(int)(local_368 * in_R8D) * 4;
    for (local_40c = 0; local_40c < (int)(in_R8D & 0xffffffe0); local_40c = local_40c + 0x20) {
      pauVar3 = (undefined1 (*) [32])(in_RSI + (long)local_40c * 4);
      in_stack_fffffffffffffb40 = *(undefined8 *)*pauVar3;
      in_stack_fffffffffffffb48 = *(undefined8 *)(*pauVar3 + 8);
      in_stack_fffffffffffffb50 = *(undefined8 *)(*pauVar3 + 0x10);
      lVar4 = in_RSI + (long)local_40c * 4;
      in_stack_fffffffffffffb38 = *(undefined8 *)(lVar4 + 0x38);
      auVar1 = vfmadd213ps_fma(*pauVar3,*(undefined1 (*) [32])(lVar2 + (long)local_40c * 4),
                               local_3a0);
      local_3a0 = ZEXT1632(auVar1);
      auVar1 = vfmadd213ps_fma(*(undefined1 (*) [32])(lVar4 + 0x20),
                               *(undefined1 (*) [32])(lVar2 + (long)local_40c * 4 + 0x20),local_3c0)
      ;
      local_3c0 = ZEXT1632(auVar1);
      auVar1 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RSI + (long)local_40c * 4 + 0x40),
                               *(undefined1 (*) [32])(lVar2 + (long)local_40c * 4 + 0x40),local_3e0)
      ;
      local_3e0 = ZEXT1632(auVar1);
      auVar1 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RSI + (long)local_40c * 4 + 0x60),
                               *(undefined1 (*) [32])(lVar2 + (long)local_40c * 4 + 0x60),local_400)
      ;
      local_400 = ZEXT1632(auVar1);
    }
    v[2] = (float)(int)in_stack_fffffffffffffb40;
    v[3] = (float)(int)((ulong)in_stack_fffffffffffffb40 >> 0x20);
    v[0] = (float)(int)in_stack_fffffffffffffb38;
    v[1] = (float)(int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
    v[4] = (float)(int)in_stack_fffffffffffffb48;
    v[5] = (float)(int)((ulong)in_stack_fffffffffffffb48 >> 0x20);
    v[6] = (float)(int)in_stack_fffffffffffffb50;
    v[7] = (float)(int)((ulong)in_stack_fffffffffffffb50 >> 0x20);
    fVar5 = reduce_vector8_0(v);
    *(float *)(in_RDX + (long)local_368 * 4) = fVar5;
    for (local_524 = in_R8D & 0xffffffe0; (int)local_524 < (int)in_R8D; local_524 = local_524 + 1) {
      auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RSI + (long)(int)local_524 * 4)),
                               ZEXT416(*(uint *)(in_RDI + (long)(int)(local_368 * in_R8D + local_524
                                                                     ) * 4)),
                               ZEXT416(*(uint *)(in_RDX + (long)local_368 * 4)));
      *(int *)(in_RDX + (long)local_368 * 4) = auVar1._0_4_;
    }
  }
  return;
}

Assistant:

void mul_mat_vec_f32_2(
    const float * restrict src0,
    const float * restrict src1,
    float * dst,
    int nrows,
    int ncols) {

    const int ncols32 = ncols & ~31;

    for (int i = 0; i < nrows; i++) {
        __m256 sum0 = _mm256_setzero_ps();
        __m256 sum1 = _mm256_setzero_ps();
        __m256 sum2 = _mm256_setzero_ps();
        __m256 sum3 = _mm256_setzero_ps();

        const float * restrict src0_row = src0 + i*ncols;
        for (int j = 0; j < ncols32; j += 32) {
            __m256 a0 = _mm256_loadu_ps(src0_row + j + 0);
            __m256 a1 = _mm256_loadu_ps(src0_row + j + 8);
            __m256 a2 = _mm256_loadu_ps(src0_row + j + 16);
            __m256 a3 = _mm256_loadu_ps(src0_row + j + 24);
            __m256 b0 = _mm256_loadu_ps(src1 + j + 0);
            __m256 b1 = _mm256_loadu_ps(src1 + j + 8);
            __m256 b2 = _mm256_loadu_ps(src1 + j + 16);
            __m256 b3 = _mm256_loadu_ps(src1 + j + 24);
#if defined(__FMA__)
            sum0 = _mm256_fmadd_ps(a0, b0, sum0);
            sum1 = _mm256_fmadd_ps(a1, b1, sum1);
            sum2 = _mm256_fmadd_ps(a2, b2, sum2);
            sum3 = _mm256_fmadd_ps(a3, b3, sum3);
#else
            sum0 = _mm256_add_ps(_mm256_mul_ps(a0, b0), sum0);
            sum1 = _mm256_add_ps(_mm256_mul_ps(a1, b1), sum1);
            sum2 = _mm256_add_ps(_mm256_mul_ps(a2, b2), sum2);
            sum3 = _mm256_add_ps(_mm256_mul_ps(a3, b3), sum3);
#endif
        }
        dst[i] = reduce_vector8_0(_mm256_add_ps(_mm256_add_ps(sum0, sum1), _mm256_add_ps(sum2, sum3)));

        for (int j = ncols32; j < ncols; j++) {
            dst[i] += src0[i*ncols + j]*src1[j];
        }
    }
}